

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeFaceNormals
          (EmbeddedGeometryInterface *this)

{
  SurfaceMesh *pSVar1;
  size_t sVar2;
  pointer puVar3;
  unsigned_long uVar4;
  Vector3 *pVVar5;
  pointer puVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  Vector3 *pVVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  size_t sVar16;
  unsigned_long uVar17;
  size_t sVar18;
  bool bVar19;
  size_t i_2;
  size_t i_1;
  size_t i_3;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> local_70;
  
  if ((this->vertexPositionsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexPositionsQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->vertexPositionsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexPositionsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::MeshData
            (&local_70,
             (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
             super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::operator=
            (&this->faceNormals,&local_70);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::~MeshData(&local_70);
  pSVar1 = (this->super_ExtrinsicGeometryInterface).super_IntrinsicGeometryInterface.
           super_BaseGeometryInterface.mesh;
  sVar2 = pSVar1->nFacesFillCount;
  if ((sVar2 == 0) ||
     (puVar3 = (pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar3 != 0xffffffffffffffff)) {
    sVar16 = 0;
  }
  else {
    sVar18 = 0;
    do {
      sVar16 = sVar2;
      if (sVar2 - 1 == sVar18) break;
      sVar16 = sVar18 + 1;
      lVar15 = sVar18 + 1;
      sVar18 = sVar16;
    } while (puVar3[lVar15] == 0xffffffffffffffff);
  }
  if (sVar16 != sVar2) {
    do {
      uVar4 = (pSVar1->fHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar16];
      pVVar5 = (this->vertexPositions).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      auVar31 = ZEXT864(0) << 0x40;
      bVar19 = true;
      auVar33 = ZEXT864(0) << 0x40;
      uVar17 = uVar4;
      do {
        auVar32 = auVar33._0_16_;
        auVar30 = auVar31._0_16_;
        if ((!bVar19) && (uVar17 == uVar4)) break;
        puVar3 = (pSVar1->heNextArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = (pSVar1->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = puVar6[uVar17];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = pVVar5[uVar7].x;
        uVar8 = puVar3[uVar17];
        uVar9 = puVar6[puVar3[uVar8]];
        auVar14._0_8_ = pVVar5[uVar7].y;
        auVar14._8_8_ = pVVar5[uVar7].z;
        auVar13._0_8_ = pVVar5[puVar6[uVar8]].y;
        auVar13._8_8_ = pVVar5[puVar6[uVar8]].z;
        auVar32 = vsubpd_avx(auVar13,auVar14);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pVVar5[uVar9].z;
        auVar30 = vmovhpd_avx(auVar27,pVVar5[uVar9].x);
        auVar29._8_8_ = pVVar5[uVar7].z;
        auVar29._0_8_ = pVVar5[uVar7].z;
        auVar13 = vunpcklpd_avx(auVar29,auVar22);
        auVar13 = vsubpd_avx(auVar30,auVar13);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pVVar5[puVar6[uVar8]].x - pVVar5[uVar7].x;
        auVar30 = vshufpd_avx(auVar32,auVar25,1);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pVVar5[uVar9].y - (double)auVar14._0_8_;
        auVar14 = vunpcklpd_avx(auVar26,auVar13);
        auVar28._0_8_ = auVar14._0_8_ * auVar30._0_8_;
        auVar28._8_8_ = auVar14._8_8_ * auVar30._8_8_;
        auVar14 = vfmsub231pd_fma(auVar28,auVar32,auVar13);
        auVar30 = vshufpd_avx(auVar13,auVar13,1);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar30._0_8_ * auVar32._0_8_;
        auVar32 = vfmsub231sd_fma(auVar23,auVar25,auVar26);
        auVar30._0_8_ = auVar31._0_8_ + auVar14._0_8_;
        auVar30._8_8_ = auVar31._8_8_ + auVar14._8_8_;
        auVar31 = ZEXT1664(auVar30);
        dVar11 = auVar33._0_8_ + auVar32._0_8_;
        auVar33 = ZEXT864((ulong)dVar11);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar11;
        bVar19 = false;
        bVar20 = puVar3[puVar3[uVar8]] != uVar17;
        uVar17 = uVar8;
      } while (bVar20);
      dVar11 = auVar30._0_8_;
      auVar24._0_8_ = dVar11 * dVar11;
      dVar12 = auVar30._8_8_;
      auVar24._8_8_ = dVar12 * dVar12;
      auVar14 = vshufpd_avx(auVar24,auVar24,1);
      auVar30 = vfmadd231sd_fma(auVar14,auVar30,auVar30);
      auVar30 = vfmadd231sd_fma(auVar30,auVar32,auVar32);
      if (auVar30._0_8_ < 0.0) {
        dVar21 = sqrt(auVar30._0_8_);
      }
      else {
        auVar30 = vsqrtsd_avx(auVar30,auVar30);
        dVar21 = auVar30._0_8_;
      }
      dVar21 = 1.0 / dVar21;
      pVVar10 = (this->faceNormals).data.
                super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      pVVar5 = pVVar10 + sVar16;
      pVVar5->x = dVar11 * dVar21;
      pVVar5->y = dVar12 * dVar21;
      pVVar10[sVar16].z = auVar32._0_8_ * dVar21;
      sVar18 = sVar16;
      do {
        sVar16 = sVar2;
        if (sVar2 - 1 == sVar18) break;
        sVar16 = sVar18 + 1;
        lVar15 = sVar18 + 1;
        sVar18 = sVar16;
      } while ((pSVar1->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar15] == 0xffffffffffffffff);
    } while (sVar16 != sVar2);
  }
  return;
}

Assistant:

void EmbeddedGeometryInterface::computeFaceNormals() {
  vertexPositionsQ.ensureHave();

  faceNormals = FaceData<Vector3>(mesh);

  for (Face f : mesh.faces()) {

    // For general polygons, take the sum of the cross products at each corner
    Vector3 normalSum = Vector3::zero();
    for (Halfedge heF : f.adjacentHalfedges()) {

      // Gather vertex positions for next three vertices
      Halfedge he = heF;
      Vector3 pA = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];

      normalSum += cross(pB - pA, pC - pA);

      // In the special case of a triangle, there is no need to to repeat at all three corners; the result will be the
      // same
      if (he.next() == heF) break;
    }

    Vector3 normal = unit(normalSum);
    faceNormals[f] = normal;
  }
}